

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QGridBox_*>::erase(QPodArrayOps<QGridBox_*> *this,QGridBox **b,qsizetype n)

{
  Data **__src;
  QArrayDataPointer<QGridBox_*> *pQVar1;
  QGridBox **ppQVar2;
  long in_RDX;
  QArrayDataPointer<QGridBox_*> *in_RSI;
  long in_RDI;
  QGridBox **e;
  QArrayDataPointer<QGridBox_*> *in_stack_ffffffffffffffb0;
  
  __src = &in_RSI->d + in_RDX;
  pQVar1 = (QArrayDataPointer<QGridBox_*> *)
           QArrayDataPointer<QGridBox_*>::begin((QArrayDataPointer<QGridBox_*> *)0x338f16);
  if ((in_RSI == pQVar1) &&
     (ppQVar2 = QArrayDataPointer<QGridBox_*>::end(in_stack_ffffffffffffffb0),
     (QGridBox **)__src != ppQVar2)) {
    *(Data ***)(in_RDI + 8) = __src;
  }
  else {
    ppQVar2 = QArrayDataPointer<QGridBox_*>::end(in_stack_ffffffffffffffb0);
    if ((QGridBox **)__src != ppQVar2) {
      ppQVar2 = QArrayDataPointer<QGridBox_*>::end(in_RSI);
      memmove(in_RSI,__src,((long)ppQVar2 - (long)__src >> 3) << 3);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }